

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O2

int Min_CubeCheck(Min_Cube_t *pCube)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  bVar3 = 0;
  uVar4 = 0;
  do {
    if ((*(uint *)&pCube->field_0x8 & 0x3ff) == uVar4) {
      return 1;
    }
    uVar2 = uVar4 >> 4;
    bVar1 = bVar3 & 0x1e;
    uVar4 = uVar4 + 1;
    bVar3 = bVar3 + 2;
  } while ((pCube->uData[uVar2] >> bVar1 & 3) != 0);
  return 0;
}

Assistant:

int Min_CubeCheck( Min_Cube_t * pCube )
{
    int i;
    for ( i = 0; i < (int)pCube->nVars; i++ )
        if ( Min_CubeGetVar( pCube, i ) == 0 )
            return 0;
    return 1;
}